

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  void *self;
  int64_t iVar1;
  char timebuf [32];
  char acStack_58 [40];
  
  self = rmlLinkedMapCreate();
  rmlLinkedMapPut(self,"age","30");
  rmlLinkedMapPut(self,"name","C Language");
  rmlLinkedMapPut(self,"gender","male");
  rml_get_current_local_time(acStack_58,0x20);
  printf("[%s] %s(%d) [%s] ",acStack_58,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x15,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  putchar(10);
  rmlLinkedMapRemove(self,"age");
  rml_get_current_local_time(acStack_58,0x20);
  printf("[%s] %s(%d) [%s] ",acStack_58,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x18,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  putchar(10);
  rmlLinkedMapRemove(self,"age");
  rml_get_current_local_time(acStack_58,0x20);
  printf("[%s] %s(%d) [%s] ",acStack_58,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x1b,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  putchar(10);
  rmlLinkedMapEach(self,printValue,(void *)0x0);
  rmlLinkedMapDestroy(self);
  return 0;
}

Assistant:

int main() {

    void *map = rmlLinkedMapCreate();
    rmlLinkedMapPut(map, "age", "30");
    rmlLinkedMapPut(map, "name", "C Language");
    rmlLinkedMapPut(map, "gender", "male");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapRemove(map, "age");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapRemove(map, "age");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapEach(map, &printValue, NULL);

    rmlLinkedMapDestroy(map);
    return 0;
}